

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

void connection_destroy_endpoint(ENDPOINT_HANDLE endpoint)

{
  CONNECTION_HANDLE pCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  LOGGER_LOG p_Var4;
  ENDPOINT_INSTANCE **ppEVar5;
  size_t local_e0;
  size_t local_d8;
  ulong local_d0;
  size_t local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  size_t local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  LOGGER_LOG l_2;
  size_t realloc_size;
  LOGGER_LOG l_1;
  size_t memmove_size;
  size_t new_count;
  ENDPOINT_HANDLE *new_endpoints;
  size_t i;
  CONNECTION_HANDLE connection;
  LOGGER_LOG l;
  ENDPOINT_HANDLE endpoint_local;
  
  if (endpoint == (ENDPOINT_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_destroy_endpoint",0x7c5,1,"NULL endpoint");
    }
  }
  else {
    pCVar1 = endpoint->connection;
    for (new_endpoints = (ENDPOINT_HANDLE *)0x0;
        (new_endpoints < (ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count &&
        (pCVar1->endpoints[(long)new_endpoints] != endpoint));
        new_endpoints = (ENDPOINT_HANDLE *)((long)new_endpoints + 1)) {
    }
    if (new_endpoints < (ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count) {
      if (pCVar1->endpoint_count == 1) {
        free(pCVar1->endpoints);
        pCVar1->endpoints = (ENDPOINT_INSTANCE **)0x0;
        pCVar1->endpoint_count = 0;
      }
      else {
        if ((ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count < new_endpoints) {
          local_60 = -1;
        }
        else {
          local_60 = (ulong)pCVar1->endpoint_count - (long)new_endpoints;
        }
        if (local_60 == 0) {
          local_70 = -1;
        }
        else {
          if ((ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count < new_endpoints) {
            local_68 = -1;
          }
          else {
            local_68 = (ulong)pCVar1->endpoint_count - (long)new_endpoints;
          }
          local_70 = local_68 + -1;
        }
        if (local_70 != 0) {
          if ((ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count < new_endpoints) {
            local_78 = -1;
          }
          else {
            local_78 = (ulong)pCVar1->endpoint_count - (long)new_endpoints;
          }
          if (local_78 == 0) {
            local_88 = -1;
          }
          else {
            if ((ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count < new_endpoints) {
              local_80 = -1;
            }
            else {
              local_80 = (ulong)pCVar1->endpoint_count - (long)new_endpoints;
            }
            local_88 = local_80 + -1;
          }
          if (local_88 == 0) {
            local_90 = 0;
          }
          else {
            if ((ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count < new_endpoints) {
              local_98 = -1;
            }
            else {
              local_98 = (ulong)pCVar1->endpoint_count - (long)new_endpoints;
            }
            if (local_98 == 0) {
              local_a8 = 0xffffffffffffffff;
            }
            else {
              if ((ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count < new_endpoints) {
                local_a0 = -1;
              }
              else {
                local_a0 = (ulong)pCVar1->endpoint_count - (long)new_endpoints;
              }
              local_a8 = local_a0 - 1;
            }
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_a8;
            if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) < 8) {
              local_c8 = 0xffffffffffffffff;
            }
            else {
              if ((ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count < new_endpoints) {
                local_b0 = -1;
              }
              else {
                local_b0 = (ulong)pCVar1->endpoint_count - (long)new_endpoints;
              }
              if (local_b0 == 0) {
                local_c0 = -1;
              }
              else {
                if ((ENDPOINT_HANDLE *)(ulong)pCVar1->endpoint_count < new_endpoints) {
                  local_b8 = -1;
                }
                else {
                  local_b8 = (ulong)pCVar1->endpoint_count - (long)new_endpoints;
                }
                local_c0 = local_b8 + -1;
              }
              local_c8 = local_c0 << 3;
            }
            local_90 = local_c8;
          }
          if (local_90 == 0xffffffffffffffff) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                        ,"connection_destroy_endpoint",0x7ec,1,"Cannot memmove endpoints, size:%zu",
                        0xffffffffffffffff);
            }
          }
          else {
            memmove(pCVar1->endpoints + (long)new_endpoints,
                    pCVar1->endpoints + (long)new_endpoints + 1,local_90);
          }
        }
        if (pCVar1->endpoint_count == 0) {
          local_d0 = 0xffffffffffffffff;
        }
        else {
          local_d0 = (ulong)pCVar1->endpoint_count - 1;
        }
        if (local_d0 == 0) {
          local_d8 = 0;
        }
        else {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_d0;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0) < 8) {
            local_e0 = 0xffffffffffffffff;
          }
          else {
            local_e0 = local_d0 << 3;
          }
          local_d8 = local_e0;
        }
        if ((local_d8 == 0xffffffffffffffff) ||
           (ppEVar5 = (ENDPOINT_INSTANCE **)realloc(pCVar1->endpoints,local_d8),
           ppEVar5 == (ENDPOINT_INSTANCE **)0x0)) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                      ,"connection_destroy_endpoint",0x7f5,1,"Memory realloc failed, size:%zu",
                      local_d8);
          }
        }
        else {
          pCVar1->endpoints = ppEVar5;
        }
        pCVar1->endpoint_count = pCVar1->endpoint_count - 1;
      }
    }
    free(endpoint);
  }
  return;
}

Assistant:

void connection_destroy_endpoint(ENDPOINT_HANDLE endpoint)
{
    if (endpoint == NULL)
    {
        LogError("NULL endpoint");
    }
    else
    {
        CONNECTION_HANDLE connection = (CONNECTION_HANDLE)endpoint->connection;
        size_t i;

        for (i = 0; i < connection->endpoint_count; i++)
        {
            if (connection->endpoints[i] == endpoint)
            {
                break;
            }
        }

        /* Codes_S_R_S_CONNECTION_01_130: [The outgoing channel associated with the endpoint shall be released by removing the endpoint from the endpoint list.] */
        /* Codes_S_R_S_CONNECTION_01_131: [Any incoming channel number associated with the endpoint shall be released.] */
        if (i < connection->endpoint_count)
        {
            // endpoint found
            if (connection->endpoint_count == 1)
            {
                free(connection->endpoints);
                connection->endpoints = NULL;
                connection->endpoint_count = 0;
            }
            else
            {
                ENDPOINT_HANDLE* new_endpoints;
                size_t new_count = safe_subtract_size_t(safe_subtract_size_t(connection->endpoint_count, i), 1);
                if (new_count > 0)
                {
                    size_t memmove_size = safe_multiply_size_t(safe_subtract_size_t(safe_subtract_size_t(connection->endpoint_count, i), 1), sizeof(ENDPOINT_HANDLE));
                    if (memmove_size != SIZE_MAX)
                    {
                        (void)memmove(connection->endpoints + i, connection->endpoints + i + 1, memmove_size);
                    }
                    else
                    {
                        LogError("Cannot memmove endpoints, size:%zu", memmove_size);
                    }
                }

                size_t realloc_size = safe_subtract_size_t(connection->endpoint_count, 1);
                realloc_size = safe_multiply_size_t(realloc_size, sizeof(ENDPOINT_HANDLE));
                if (realloc_size == SIZE_MAX ||
                    (new_endpoints = (ENDPOINT_HANDLE*)realloc(connection->endpoints, realloc_size)) == NULL)
                {
                    LogError("Memory realloc failed, size:%zu", realloc_size);
                }
                else
                {
                    connection->endpoints = new_endpoints;
                }

                connection->endpoint_count--;
            }
        }

        free(endpoint);
    }
}